

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O3

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::
BasicRateTargetingSVC3TL3SLExternalResizePattern1HighResTest(DatarateTestSVC *this)

{
  bool bVar1;
  uint uVar2;
  ParamType *pPVar3;
  uint uVar4;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  ResizingVideoSource_conflict video;
  AssertHelper local_60;
  HasNewFatalFailureHelper local_58;
  undefined **local_40;
  aom_image_t *local_38;
  
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x3f;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  pPVar3 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
           ::GetParam();
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(&DAT_00c4f708 +
                (long)(pPVar3->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                      ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_unsigned_int,_int>.
                      super__Tuple_impl<2UL,_int,_unsigned_int,_int>.
                      super__Tuple_impl<3UL,_unsigned_int,_int>.super__Tuple_impl<4UL,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl * 4);
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_w = 0x73a;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_h = 0x456;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_forced_max_frame_width = 0x73a;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_forced_max_frame_height = 0x456;
  ResizingVideoSource::ResizingVideoSource
            ((ResizingVideoSource *)&stack0xffffffffffffffc0,1,0x73a,0x456);
  (*(this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])(this);
  this->external_resize_dynamic_drop_layer_ = true;
  this->external_resize_pattern_ = 1;
  this->number_temporal_layers_ = 3;
  this->number_spatial_layers_ = 3;
  uVar2 = (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
  this->target_layer_bitrate_[0] = uVar2 >> 4;
  this->target_layer_bitrate_[1] = ((uVar2 >> 3) * 0x46) / 100;
  this->target_layer_bitrate_[2] = uVar2 >> 3;
  uVar4 = uVar2 * 3 >> 3;
  this->target_layer_bitrate_[3] = uVar2 * 3 >> 4;
  this->target_layer_bitrate_[4] = (uVar4 * 0x46) / 100;
  this->target_layer_bitrate_[5] = uVar4;
  uVar2 = uVar2 >> 1 & 0x1fffffff;
  this->target_layer_bitrate_[6] = uVar2 >> 1;
  this->target_layer_bitrate_[7] = (uVar2 * 0x46) / 100;
  this->target_layer_bitrate_[8] = uVar2;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(&local_58);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&this->super_DatarateTest,&stack0xffffffffffffffc0);
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper(&local_58);
    if (local_58.has_new_fatal_failure_ == false) goto LAB_0060e047;
  }
  testing::Message::Message((Message *)&local_58);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
             ,0xb79,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (local_58.super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface !=
      (_func_int **)0x0) {
    (**(code **)(*local_58.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_0060e047:
  local_40 = &PTR__DummyVideoSource_010306b0;
  aom_img_free(local_38);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC3TL3SLExternalResizePattern1HighResTest() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;
    const int bitrate_array[2] = { 600, 1200 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    cfg_.g_w = 1850;
    cfg_.g_h = 1110;
    cfg_.g_forced_max_frame_width = 1850;
    cfg_.g_forced_max_frame_height = 1110;
    ResizingVideoSource video(1, 1850, 1110);
    ResetModel();
    external_resize_dynamic_drop_layer_ = true;
    external_resize_pattern_ = 1;
    number_temporal_layers_ = 3;
    number_spatial_layers_ = 3;
    // SL0
    const int bitrate_sl0 = 1 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[0] = 50 * bitrate_sl0 / 100;
    target_layer_bitrate_[1] = 70 * bitrate_sl0 / 100;
    target_layer_bitrate_[2] = bitrate_sl0;
    // SL1
    const int bitrate_sl1 = 3 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[3] = 50 * bitrate_sl1 / 100;
    target_layer_bitrate_[4] = 70 * bitrate_sl1 / 100;
    target_layer_bitrate_[5] = bitrate_sl1;
    // SL2
    const int bitrate_sl2 = 4 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[6] = 50 * bitrate_sl2 / 100;
    target_layer_bitrate_[7] = 70 * bitrate_sl2 / 100;
    target_layer_bitrate_[8] = bitrate_sl2;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  }